

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O1

TRef fold_simplify_numpow_k(jit_State *J)

{
  double dVar1;
  IRRef1 IVar2;
  TRef TVar3;
  
  dVar1 = *(double *)&(J->fold).right[1].i;
  if ((dVar1 == 0.0) && (!NAN(dVar1))) {
    TVar3 = lj_ir_knum_u64(J,0x3ff0000000000000);
    return TVar3;
  }
  if ((dVar1 == 1.0) && (!NAN(dVar1))) {
    return (TRef)(J->fold).ins.field_0.op1;
  }
  if ((dVar1 == 2.0) && (!NAN(dVar1))) {
    IVar2 = (J->fold).ins.field_0.op1;
    (J->fold).ins.field_0.ot = 0x2b0e;
    (J->fold).ins.field_0.op2 = IVar2;
    TVar3 = lj_opt_fold(J);
    return TVar3;
  }
  return 0;
}

Assistant:

LJFOLD(POW any KNUM)
LJFOLDF(simplify_numpow_k)
{
  if (knumright == 0.0)  /* x ^ 0 ==> 1 */
    return lj_ir_knum_one(J);  /* Result must be a number, not an int. */
  else if (knumright == 1.0)  /* x ^ 1 ==> x */
    return LEFTFOLD;
  else if (knumright == 2.0)  /* x ^ 2 ==> x * x */
    return emitir(IRTN(IR_MUL), fins->op1, fins->op1);
  else
    return NEXTFOLD;
}